

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::tuple_caster<std::pair,long,long>::load_impl<0ul,1ul>
          (tuple_caster<std::pair,long,long> *this,undefined8 *seq,bool convert)

{
  bool bVar1;
  bool bVar2;
  handle local_78;
  handle local_70 [2];
  undefined8 local_60;
  undefined8 local_58;
  object local_50 [2];
  undefined8 local_40;
  undefined8 local_38;
  object oStack_30;
  
  local_40 = *seq;
  local_38 = 0;
  oStack_30.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor::operator_cast_to_object((accessor *)local_70);
  bVar1 = type_caster<long,_void>::load((type_caster<long,_void> *)this,local_70[0],convert);
  local_60 = *seq;
  local_58 = 1;
  local_50[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor::operator_cast_to_object((accessor *)&local_78);
  bVar2 = type_caster<long,_void>::load((type_caster<long,_void> *)(this + 8),local_78,convert);
  object::~object((object *)&local_78);
  object::~object(local_50);
  object::~object((object *)local_70);
  object::~object(&oStack_30);
  return bVar1 && bVar2;
}

Assistant:

bool load_impl(const sequence &seq, bool convert, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(subcasters).load(seq[Is], convert)))
            return false;
#else
        for (bool r : {std::get<Is>(subcasters).load(seq[Is], convert)...})
            if (!r)
                return false;
#endif
        return true;
    }